

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::DockBuilderSplitNode
                  (ImGuiID id,ImGuiDir split_dir,float size_ratio_for_node_at_dir,
                  ImGuiID *out_id_at_dir,ImGuiID *out_id_at_opposite_dir)

{
  ImGuiID IVar1;
  ImGuiID IVar2;
  ImGuiContext *ctx_00;
  bool bVar3;
  float local_84;
  ImGuiID id_at_opposite_dir;
  ImGuiID id_at_dir;
  ImGuiDockRequest req;
  ImGuiDockNode *node;
  ImGuiContext *ctx;
  ImGuiID *out_id_at_opposite_dir_local;
  ImGuiID *out_id_at_dir_local;
  float size_ratio_for_node_at_dir_local;
  ImGuiDir split_dir_local;
  ImGuiID id_local;
  
  ctx_00 = GImGui;
  if (split_dir == -1) {
    __assert_fail("split_dir != ImGuiDir_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3928,
                  "ImGuiID ImGui::DockBuilderSplitNode(ImGuiID, ImGuiDir, float, ImGuiID *, ImGuiID *)"
                 );
  }
  req.UndockTargetNode = DockContextFindNodeByID(GImGui,id);
  if (req.UndockTargetNode == (ImGuiDockNode *)0x0) {
    __assert_fail("node != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x392e,
                  "ImGuiID ImGui::DockBuilderSplitNode(ImGuiID, ImGuiDir, float, ImGuiID *, ImGuiID *)"
                 );
  }
  bVar3 = ImGuiDockNode::IsSplitNode(req.UndockTargetNode);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    ImGuiDockRequest::ImGuiDockRequest((ImGuiDockRequest *)&id_at_opposite_dir);
    id_at_opposite_dir = 3;
    req.Type = ImGuiDockRequestType_None;
    req._4_4_ = 0;
    req.DockTargetWindow = (ImGuiWindow *)req.UndockTargetNode;
    req.DockTargetNode = (ImGuiDockNode *)0x0;
    local_84 = size_ratio_for_node_at_dir;
    if ((split_dir != 0) && (split_dir != 2)) {
      local_84 = 1.0 - size_ratio_for_node_at_dir;
    }
    req.DockPayload._0_4_ = split_dir;
    req.DockPayload._4_4_ = ImSaturate(local_84);
    req.DockSplitDir._0_1_ = 0;
    DockContextProcessDock(ctx_00,(ImGuiDockRequest *)&id_at_opposite_dir);
    IVar1 = (req.UndockTargetNode)->ChildNodes[(int)(uint)(split_dir != 0 && split_dir != 2)]->ID;
    IVar2 = (req.UndockTargetNode)->ChildNodes[(int)(uint)(split_dir == 0 || split_dir == 2)]->ID;
    if (out_id_at_dir != (ImGuiID *)0x0) {
      *out_id_at_dir = IVar1;
    }
    if (out_id_at_opposite_dir != (ImGuiID *)0x0) {
      *out_id_at_opposite_dir = IVar2;
    }
    return IVar1;
  }
  __assert_fail("!node->IsSplitNode()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x3932,
                "ImGuiID ImGui::DockBuilderSplitNode(ImGuiID, ImGuiDir, float, ImGuiID *, ImGuiID *)"
               );
}

Assistant:

ImGuiID ImGui::DockBuilderSplitNode(ImGuiID id, ImGuiDir split_dir, float size_ratio_for_node_at_dir, ImGuiID* out_id_at_dir, ImGuiID* out_id_at_opposite_dir)
{
    ImGuiContext* ctx = GImGui;
    IM_ASSERT(split_dir != ImGuiDir_None);
    IMGUI_DEBUG_LOG_DOCKING("DockBuilderSplitNode node 0x%08X, split_dir %d\n", id, split_dir);

    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (node == NULL)
    {
        IM_ASSERT(node != NULL);
        return 0;
    }

    IM_ASSERT(!node->IsSplitNode()); // Assert if already Split

    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Split;
    req.DockTargetWindow = NULL;
    req.DockTargetNode = node;
    req.DockPayload = NULL;
    req.DockSplitDir = split_dir;
    req.DockSplitRatio = ImSaturate((split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? size_ratio_for_node_at_dir : 1.0f - size_ratio_for_node_at_dir);
    req.DockSplitOuter = false;
    DockContextProcessDock(ctx, &req);

    ImGuiID id_at_dir = node->ChildNodes[(split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 0 : 1]->ID;
    ImGuiID id_at_opposite_dir = node->ChildNodes[(split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 1 : 0]->ID;
    if (out_id_at_dir)
        *out_id_at_dir = id_at_dir;
    if (out_id_at_opposite_dir)
        *out_id_at_opposite_dir = id_at_opposite_dir;
    return id_at_dir;
}